

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

MergeResult
mergesort_lcp_3way_parallel<false>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  byte *pbVar1;
  lcp_t *lcp_output_00;
  uchar **strings_input_00;
  uchar **strings_output_00;
  lcp_t *lcp_output_01;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  bool bVar5;
  lcp_t *__src;
  lcp_t *__dest;
  MergeResult MVar6;
  MergeResult MVar7;
  MergeResult MVar8;
  ostream *poVar9;
  uchar **ppuVar10;
  ulong uVar11;
  lcp_t *lcp_input_00;
  lcp_t *lcp_input_01;
  size_t sVar12;
  uchar **ppuVar13;
  char *__assertion;
  byte bVar14;
  lcp_t lVar15;
  size_t n_00;
  size_t n_01;
  lcp_t in_R9;
  long lVar16;
  MergeResult MVar17;
  ulong uVar18;
  double dVar19;
  MergeResult MVar20;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 uVar21;
  
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"mergesort_lcp_3way_parallel",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(): n=",6);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  uVar21 = CONCAT13(10,(int3)in_stack_ffffffffffffff4c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,&stack0xffffffffffffff4f,1);
  if (0x1f < n) {
    uVar18 = n / 3;
    dVar19 = (((double)CONCAT44(0x45300000,(int)(n >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.6666666666666666;
    uVar11 = (ulong)dVar19;
    uVar11 = (long)(dVar19 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
    MVar6 = mergesort_lcp_3way_parallel<true>
                      (strings_input,strings_output,lcp_input,lcp_output,uVar18);
    ppuVar10 = strings_input + uVar18;
    ppuVar13 = strings_output + uVar18;
    lcp_input_00 = lcp_input + uVar18;
    lcp_output_00 = lcp_output + uVar18;
    n_00 = uVar11 - uVar18;
    MVar7 = mergesort_lcp_3way_parallel<true>(ppuVar10,ppuVar13,lcp_input_00,lcp_output_00,n_00);
    lVar16 = uVar11 * 8;
    strings_input_00 = strings_input + uVar11;
    strings_output_00 = strings_output + uVar11;
    lcp_input_01 = lcp_input + uVar11;
    lcp_output_01 = lcp_output + uVar11;
    n_01 = n - uVar11;
    MVar8 = mergesort_lcp_3way_parallel<true>
                      (strings_input_00,strings_output_00,lcp_input_01,lcp_output_01,n_01);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"mergesort_lcp_3way_parallel",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(): m0=",7);
    MVar20 = MVar6;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,MVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", m1=",5);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,MVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", m2=",5);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,MVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    if (MVar6 != MVar7) {
      sVar12 = uVar18 * 8;
      if (MVar7 == MVar8) {
        if (MVar6 == SortedInPlace) {
          memcpy(strings_output,strings_input,sVar12);
          memcpy(lcp_output,lcp_input,sVar12);
        }
        else {
          memcpy(strings_input,strings_output,sVar12);
          memcpy(lcp_input,lcp_output,sVar12);
        }
        MVar6 = (MergeResult)(MVar6 == SortedInPlace);
      }
      else {
        if (MVar7 == SortedInPlace) {
          sVar12 = lVar16 + uVar18 * -8;
          if (sVar12 != 0) {
            MVar6 = MVar20;
            memcpy(ppuVar13,ppuVar10,sVar12);
            MVar20 = MVar6;
          }
          MVar17 = SortedInTemp;
          MVar7 = SortedInTemp;
          __src = lcp_input_00;
          __dest = lcp_output_00;
        }
        else {
          sVar12 = lVar16 + uVar18 * -8;
          if (sVar12 != 0) {
            MVar6 = MVar20;
            memcpy(ppuVar10,ppuVar13,sVar12);
            MVar20 = MVar6;
          }
          MVar17 = SortedInPlace;
          MVar7 = SortedInPlace;
          __src = lcp_output_00;
          __dest = lcp_input_00;
        }
        sVar12 = lVar16 + uVar18 * -8;
        if (sVar12 != 0) {
          MVar6 = MVar20;
          memcpy(__dest,__src,sVar12);
          MVar7 = MVar17;
          MVar20 = MVar6;
        }
      }
    }
    if (MVar7 != MVar8) {
      lVar16 = n * 8;
      if (MVar8 == SortedInPlace) {
        sVar12 = lVar16 + uVar11 * -8;
        if (sVar12 != 0) {
          memcpy(strings_output_00,strings_input_00,sVar12);
          MVar20 = MVar6;
        }
        MVar8 = SortedInTemp;
        sVar12 = lVar16 + uVar11 * -8;
        if (sVar12 != 0) {
          memcpy(lcp_output_01,lcp_input_01,sVar12);
          MVar8 = SortedInTemp;
        }
      }
      else {
        sVar12 = lVar16 + uVar11 * -8;
        if (sVar12 != 0) {
          memcpy(strings_input_00,strings_output_00,sVar12);
        }
        MVar8 = SortedInPlace;
        sVar12 = lVar16 + uVar11 * -8;
        if (sVar12 != 0) {
          memcpy(lcp_input_01,lcp_output_01,sVar12);
          MVar8 = SortedInPlace;
        }
      }
    }
    if (MVar6 == MVar7) {
      if (MVar7 == MVar8) {
        if (MVar6 != SortedInPlace) {
          merge_lcp_3way<false>
                    (strings_output,lcp_output,uVar18,ppuVar13,lcp_output_00,n_00,strings_output_00,
                     lcp_output_01,n_01,strings_input,(lcp_t *)CONCAT44(uVar21,MVar20));
          return SortedInPlace;
        }
        merge_lcp_3way<false>
                  (strings_input,lcp_input,uVar18,ppuVar10,lcp_input_00,n_00,strings_input_00,
                   lcp_input_01,n_01,strings_output,(lcp_t *)CONCAT44(uVar21,MVar20));
        return SortedInTemp;
      }
      __assertion = "m1 == m2";
    }
    else {
      __assertion = "m0 == m1";
    }
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x397,
                  "MergeResult mergesort_lcp_3way_parallel(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = false]"
                 );
  }
  if (1 < (long)n) {
    uVar11 = n & 0xffffffff;
    ppuVar10 = strings_input;
    do {
      iVar4 = (int)uVar11;
      uVar11 = (ulong)(iVar4 - 1);
      pbVar2 = ppuVar10[1];
      ppuVar10 = ppuVar10 + 1;
      for (ppuVar13 = ppuVar10; strings_input < ppuVar13; ppuVar13 = ppuVar13 + -1) {
        pbVar3 = ppuVar13[-1];
        bVar14 = *pbVar3;
        in_R9 = CONCAT71((int7)(in_R9 >> 8),*pbVar2);
        if (bVar14 != 0 && bVar14 == *pbVar2) {
          lVar16 = 1;
          do {
            bVar14 = pbVar3[lVar16];
            pbVar1 = pbVar2 + lVar16;
            in_R9 = CONCAT71((int7)(in_R9 >> 8),*pbVar1);
            if (bVar14 == 0) break;
            lVar16 = lVar16 + 1;
          } while (bVar14 == *pbVar1);
        }
        if (bVar14 <= (byte)in_R9) break;
        *ppuVar13 = pbVar3;
      }
      *ppuVar13 = pbVar2;
    } while (2 < iVar4);
  }
  if (n != 1) {
    uVar11 = 0;
    do {
      uVar18 = (ulong)((int)uVar11 + 1);
      lVar16 = 0;
      lVar15 = 0;
      do {
        if ((strings_input[uVar11][lVar16] == '\0') ||
           (strings_input[uVar11][lVar16] != strings_input[uVar18][lVar16])) {
          bVar5 = false;
          in_R9 = lVar15;
        }
        else {
          lVar15 = lVar15 + 1;
          bVar5 = true;
        }
        lVar16 = lVar16 + 1;
      } while (bVar5);
      lcp_input[uVar11] = in_R9;
      uVar11 = uVar18;
    } while (uVar18 < n - 1);
  }
  return SortedInPlace;
}

Assistant:

MergeResult
mergesort_lcp_3way_parallel(unsigned char** restrict strings_input,
                   unsigned char** restrict strings_output,
                   lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
                   size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		for (unsigned i=0; i < n-1; ++i)
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
		return SortedInPlace;
	}
	const size_t split0 = n/3,
	             split1 = size_t((2.0/3.0)*n);
	MergeResult m0, m1, m2;
#pragma omp task shared(m0)
	m0 = mergesort_lcp_3way_parallel<true>(
			strings_input,        strings_output,
			lcp_input,            lcp_output,
			split0);
#pragma omp task shared(m1)
	m1 = mergesort_lcp_3way_parallel<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			split1-split0);
#pragma omp task shared(m2)
	m2 = mergesort_lcp_3way_parallel<true>(
			strings_input+split1, strings_output+split1,
			lcp_input+split1,     lcp_output+split1,
			n-split1);
#pragma omp taskwait
	debug() << __func__ << "(): m0="<<m0<<", m1="<<m1<<", m2="<<m2<<"\n";
	if (m0 != m1) {
		if (m1 != m2) {
			// m0 == m2 != m1
			if (m1 == SortedInPlace) {
				std::copy(strings_input+split0, strings_input+split1,
						strings_output+split0);
				std::copy(lcp_input+split0, lcp_input+split1,
						lcp_output+split0);
				m1 = SortedInTemp;
			} else {
				std::copy(strings_output+split0, strings_output+split1,
						strings_input+split0);
				std::copy(lcp_output+split0, lcp_output+split1,
						lcp_input+split0);
				m1 = SortedInPlace;
			}
		} else {
			// m0 != m1 == m2
			if (m0 == SortedInPlace) {
				std::copy(strings_input, strings_input+split0,
						strings_output);
				std::copy(lcp_input, lcp_input+split0,
						lcp_output);
				m0 = SortedInTemp;
			} else {
				std::copy(strings_output, strings_output+split0,
						strings_input);
				std::copy(lcp_output, lcp_output+split0,
						lcp_input);
				m0 = SortedInPlace;
			}
		}
	}
	if (m1 != m2) {
		if (m2 == SortedInPlace) {
			std::copy(strings_input+split1, strings_input+n,
					strings_output+split1);
			std::copy(lcp_input+split1, lcp_input+n,
					lcp_output+split1);
			m2 = SortedInTemp;
		} else {
			std::copy(strings_output+split1, strings_output+n,
					strings_input+split1);
			std::copy(lcp_output+split1, lcp_output+n,
					lcp_input+split1);
			m2 = SortedInPlace;
		}
	}
	assert(m0 == m1); assert(m1 == m2);
	if (m0 == SortedInPlace) {
		merge_lcp_3way<OutputLCP>(
			   strings_input,        lcp_input,        split0,
			   strings_input+split0, lcp_input+split0, split1-split0,
			   strings_input+split1, lcp_input+split1, n-split1,
			   strings_output, lcp_output);
		//debug() << __func__ << "(): checking merged result, in -> out\n";
		if (OutputLCP) check_input(strings_output, lcp_output, n);
		return SortedInTemp;
	} else {
		merge_lcp_3way<OutputLCP>(
			   strings_output,        lcp_output,        split0,
			   strings_output+split0, lcp_output+split0, split1-split0,
			   strings_output+split1, lcp_output+split1, n-split1,
			   strings_input, lcp_input);
		//debug() << __func__ << "(): checking merged result, out -> in\n";
		if (OutputLCP) check_input(strings_input, lcp_input, n);
		return SortedInPlace;
	}
}